

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

OSToken * OSToken::createToken
                    (string *basePath,string *tokenDir,int umask,ByteString *label,
                    ByteString *serial)

{
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  OSToken *pOVar6;
  __mode_t in_EDX;
  string *in_RSI;
  ObjectFile *in_RDI;
  OSAttribute tokenFlags;
  OSAttribute tokenSerial;
  OSAttribute tokenLabel;
  CK_ULONG flags;
  string tokenPath;
  ObjectFile tokenObject;
  Directory baseDir;
  unsigned_long in_stack_fffffffffffff9c8;
  undefined5 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d5;
  undefined1 in_stack_fffffffffffff9d6;
  undefined1 in_stack_fffffffffffff9d7;
  undefined4 in_stack_fffffffffffff9d8;
  __mode_t _Var7;
  undefined1 in_stack_fffffffffffff9dc;
  string *this;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  OSAttribute *in_stack_fffffffffffffa00;
  OSAttribute *in_stack_fffffffffffffa18;
  Directory *in_stack_fffffffffffffa20;
  ObjectFile *in_stack_fffffffffffffa28;
  string local_5c0 [15];
  undefined1 in_stack_fffffffffffffa4f;
  string *in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa5c;
  string *in_stack_fffffffffffffa60;
  OSToken *in_stack_fffffffffffffa68;
  ObjectFile *in_stack_fffffffffffffa70;
  string local_580 [32];
  string local_560 [32];
  string local_540 [116];
  int in_stack_fffffffffffffb34;
  string *in_stack_fffffffffffffb38;
  OSToken *in_stack_fffffffffffffb40;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [136];
  byte local_130;
  string local_e8 [32];
  undefined4 local_c8;
  string local_b8 [32];
  Directory local_98;
  __mode_t local_1c;
  OSToken *local_8;
  
  this = local_b8;
  local_1c = in_EDX;
  std::__cxx11::string::string(this,(string *)in_RDI);
  Directory::Directory(in_stack_fffffffffffffa20,(string *)in_stack_fffffffffffffa18);
  std::__cxx11::string::~string(local_b8);
  uVar1 = Directory::isValid(&local_98);
  if ((bool)uVar1) {
    std::__cxx11::string::string(local_e8,in_RSI);
    iVar4 = Directory::mkdir(&local_98,(char *)local_e8,local_1c);
    bVar2 = (byte)iVar4;
    bVar3 = bVar2 ^ 0xff;
    std::__cxx11::string::~string(local_e8);
    if ((bVar3 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),(char *)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffff9dc
                                                                           ,
                                                  in_stack_fffffffffffff9d8)))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff9d7,
                              CONCAT16(in_stack_fffffffffffff9d6,
                                       CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0)
                                      )));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffff9dc
                                                                           ,
                                                  in_stack_fffffffffffff9d8)))),
                     (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                      CONCAT16(in_stack_fffffffffffff9d6,
                                               CONCAT15(in_stack_fffffffffffff9d5,
                                                        in_stack_fffffffffffff9d0))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffff9dc
                                                                           ,
                                                  in_stack_fffffffffffff9d8)))),
                     (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                      CONCAT16(in_stack_fffffffffffff9d6,
                                               CONCAT15(in_stack_fffffffffffff9d5,
                                                        in_stack_fffffffffffff9d0))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),(char *)this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffff9dc
                                                                           ,local_1c)))),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff9d7,
                              CONCAT16(in_stack_fffffffffffff9d6,
                                       CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0)
                                      )));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffff9dc
                                                                           ,local_1c)))),
                     (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                      CONCAT16(in_stack_fffffffffffff9d6,
                                               CONCAT15(in_stack_fffffffffffff9d5,
                                                        in_stack_fffffffffffff9d0))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(in_stack_fffffffffffff9dc
                                                                           ,local_1c)))),
                     (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                      CONCAT16(in_stack_fffffffffffff9d6,
                                               CONCAT15(in_stack_fffffffffffff9d5,
                                                        in_stack_fffffffffffff9d0))));
      ObjectFile::ObjectFile
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                 in_stack_fffffffffffffa5c,in_stack_fffffffffffffa50,(bool)in_stack_fffffffffffffa4f
                );
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      std::__cxx11::string::~string(local_218);
      if ((local_130 & 1) == 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),(char *)this);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffff9dc,local_1c)))),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff9d7,
                                CONCAT16(in_stack_fffffffffffff9d6,
                                         CONCAT15(in_stack_fffffffffffff9d5,
                                                  in_stack_fffffffffffff9d0))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffff9dc,local_1c)))),
                       (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                        CONCAT16(in_stack_fffffffffffff9d6,
                                                 CONCAT15(in_stack_fffffffffffff9d5,
                                                          in_stack_fffffffffffff9d0))));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffff9dc,local_1c)))),
                       (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                        CONCAT16(in_stack_fffffffffffff9d6,
                                                 CONCAT15(in_stack_fffffffffffff9d5,
                                                          in_stack_fffffffffffff9d0))));
        std::__cxx11::string::~string(local_2d8);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::~string(local_318);
        uVar5 = std::__cxx11::string::c_str();
        softHSMLog(3,"createToken",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                   ,0x5e,"Failed to create the token object: %s",uVar5);
        std::__cxx11::string::string(local_338,in_RSI);
        Directory::rmdir(&local_98,(char *)local_338);
        std::__cxx11::string::~string(local_338);
        local_8 = (OSToken *)0x0;
        local_c8 = 1;
        std::__cxx11::string::~string(local_2b8);
      }
      else {
        OSAttribute::OSAttribute
                  (in_stack_fffffffffffffa00,
                   (ByteString *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
        OSAttribute::OSAttribute
                  (in_stack_fffffffffffffa00,
                   (ByteString *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
        OSAttribute::OSAttribute
                  ((OSAttribute *)
                   CONCAT17(in_stack_fffffffffffff9d7,
                            CONCAT16(in_stack_fffffffffffff9d6,
                                     CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0)))
                   ,in_stack_fffffffffffff9c8);
        in_stack_fffffffffffff9d7 =
             ObjectFile::setAttribute
                       (in_stack_fffffffffffffa28,(CK_ATTRIBUTE_TYPE)in_stack_fffffffffffffa20,
                        in_stack_fffffffffffffa18);
        _Var7 = local_1c;
        if ((((bool)in_stack_fffffffffffff9d7) &&
            (in_stack_fffffffffffff9d6 =
                  ObjectFile::setAttribute
                            (in_stack_fffffffffffffa28,(CK_ATTRIBUTE_TYPE)in_stack_fffffffffffffa20,
                             in_stack_fffffffffffffa18), _Var7 = local_1c,
            (bool)in_stack_fffffffffffff9d6)) &&
           (in_stack_fffffffffffff9d5 =
                 ObjectFile::setAttribute
                           (in_stack_fffffffffffffa28,(CK_ATTRIBUTE_TYPE)in_stack_fffffffffffffa20,
                            in_stack_fffffffffffffa18), _Var7 = local_1c,
           (bool)in_stack_fffffffffffff9d5)) {
          uVar5 = std::__cxx11::string::c_str();
          softHSMLog(7,"createToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x7f,"Created new token %s",uVar5);
          pOVar6 = (OSToken *)operator_new(0xe8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(1,in_stack_fffffffffffff9f8),(char *)this);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffff9dc,local_1c)))),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff9d7,
                                  CONCAT16(in_stack_fffffffffffff9d6,
                                           CONCAT15(in_stack_fffffffffffff9d5,
                                                    in_stack_fffffffffffff9d0))));
          OSToken(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb34);
          local_8 = pOVar6;
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffa20);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffa00);
        }
        else {
          softHSMLog(3,"createToken",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                     ,0x76,"Failed to set the token attributes");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),(char *)this)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffff9dc,_Var7)))),
                         (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                          CONCAT16(in_stack_fffffffffffff9d6,
                                                   CONCAT15(in_stack_fffffffffffff9d5,
                                                            in_stack_fffffffffffff9d0))));
          Directory::remove(&local_98,(char *)local_540);
          std::__cxx11::string::~string(local_540);
          std::__cxx11::string::~string(local_560);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8),(char *)this)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar1,CONCAT16(bVar2,CONCAT15(bVar3,CONCAT14(
                                                  in_stack_fffffffffffff9dc,_Var7)))),
                         (char *)CONCAT17(in_stack_fffffffffffff9d7,
                                          CONCAT16(in_stack_fffffffffffff9d6,
                                                   CONCAT15(in_stack_fffffffffffff9d5,
                                                            in_stack_fffffffffffff9d0))));
          Directory::remove(&local_98,(char *)local_580);
          std::__cxx11::string::~string(local_580);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffa60);
          std::__cxx11::string::string(local_5c0,in_RSI);
          Directory::rmdir(&local_98,(char *)local_5c0);
          std::__cxx11::string::~string(local_5c0);
          local_8 = (OSToken *)0x0;
        }
        local_c8 = 1;
        OSAttribute::~OSAttribute
                  ((OSAttribute *)
                   CONCAT17(in_stack_fffffffffffff9d7,
                            CONCAT16(in_stack_fffffffffffff9d6,
                                     CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0)))
                  );
        OSAttribute::~OSAttribute
                  ((OSAttribute *)
                   CONCAT17(in_stack_fffffffffffff9d7,
                            CONCAT16(in_stack_fffffffffffff9d6,
                                     CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0)))
                  );
        OSAttribute::~OSAttribute
                  ((OSAttribute *)
                   CONCAT17(in_stack_fffffffffffff9d7,
                            CONCAT16(in_stack_fffffffffffff9d6,
                                     CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0)))
                  );
      }
      ObjectFile::~ObjectFile(in_RDI);
    }
    else {
      local_8 = (OSToken *)0x0;
      local_c8 = 1;
    }
  }
  else {
    softHSMLog(3,"createToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,0x4d,"Could not create the Directory object");
    local_8 = (OSToken *)0x0;
    local_c8 = 1;
  }
  Directory::~Directory
            ((Directory *)
             CONCAT17(in_stack_fffffffffffff9d7,
                      CONCAT16(in_stack_fffffffffffff9d6,
                               CONCAT15(in_stack_fffffffffffff9d5,in_stack_fffffffffffff9d0))));
  return local_8;
}

Assistant:

OSToken* OSToken::createToken(const std::string basePath, const std::string tokenDir, int umask, const ByteString& label, const ByteString& serial)
{
	Directory baseDir(basePath);

	if (!baseDir.isValid())
	{
		ERROR_MSG("Could not create the Directory object");
		return NULL;
	}

	// Create the token directory
	if (!baseDir.mkdir(tokenDir, umask))
	{
		// Error msg is generated by mkdir
		return NULL;
	}

	// Create the token object
	ObjectFile tokenObject(NULL, basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.object", umask, basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.lock", true);

	if (!tokenObject.valid)
	{
		std::string tokenPath = basePath + OS_PATHSEP + tokenDir + OS_PATHSEP + "token.[object|lock]";
		ERROR_MSG("Failed to create the token object: %s", tokenPath.c_str());

		baseDir.rmdir(tokenDir);

		return NULL;
	}

	// Set the initial attributes
	CK_ULONG flags =
		CKF_RNG |
		CKF_LOGIN_REQUIRED | // FIXME: check
		CKF_RESTORE_KEY_NOT_NEEDED |
		CKF_TOKEN_INITIALIZED |
		CKF_SO_PIN_LOCKED |
		CKF_SO_PIN_TO_BE_CHANGED;

	OSAttribute tokenLabel(label);
	OSAttribute tokenSerial(serial);
	OSAttribute tokenFlags(flags);

	if (!tokenObject.setAttribute(CKA_OS_TOKENLABEL, tokenLabel) ||
	    !tokenObject.setAttribute(CKA_OS_TOKENSERIAL, tokenSerial) ||
	    !tokenObject.setAttribute(CKA_OS_TOKENFLAGS, tokenFlags))
	{
		ERROR_MSG("Failed to set the token attributes");

		baseDir.remove(tokenDir + OS_PATHSEP + "token.object");
		baseDir.remove(tokenDir + OS_PATHSEP + "token.lock");
		baseDir.rmdir(tokenDir);

		return NULL;
	}

	DEBUG_MSG("Created new token %s", tokenDir.c_str());

	return new OSToken(basePath + OS_PATHSEP + tokenDir, umask);
}